

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O3

void __thiscall
QPlainTestLogger::printBenchmarkResults(QPlainTestLogger *this,QList<QBenchmarkResult> *results)

{
  array<char,_1024UL> *msg;
  double dVar1;
  int *piVar2;
  int iVar3;
  QBenchmarkResult *result;
  QBenchmarkResult *pQVar4;
  char *pcVar5;
  undefined1 *puVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  const_iterator __begin1;
  QBenchmarkResult *pQVar11;
  char *pcVar12;
  const_iterator __end1;
  QBenchmarkResult *pQVar13;
  long in_FS_OFFSET;
  qreal value;
  double dVar14;
  QList<QBenchmarkResult> *__range1;
  double local_470;
  QByteArray local_458;
  FixedBufString<1022> local_440;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (results->d).size;
  if (lVar8 == 0) goto LAB_00120eed;
  msg = &local_440.buf;
  pQVar11 = (results->d).ptr;
  pQVar13 = pQVar11 + lVar8;
  memset(&local_440.buf,0xaa,0x400);
  lVar9 = lVar8 * 0x50;
  local_470 = 1000000000.0;
  pQVar4 = pQVar11;
  do {
    if ((pQVar4->measurement).metric == WalltimeNanoseconds) goto LAB_00120bcf;
    pQVar4 = pQVar4 + 1;
    lVar9 = lVar9 + -0x50;
  } while (lVar9 != 0);
  lVar9 = lVar8 * 0x50;
  local_470 = 1000.0;
  pQVar4 = pQVar11;
  do {
    if ((pQVar4->measurement).metric == WalltimeMilliseconds) goto LAB_00120bcf;
    pQVar4 = pQVar4 + 1;
    lVar9 = lVar9 + -0x50;
  } while (lVar9 != 0);
  local_470 = 0.0;
  goto LAB_00120bde;
LAB_00120bcf:
  local_470 = (pQVar4->measurement).value / local_470;
LAB_00120bde:
  if (lVar8 != 0) {
    do {
      local_440.used = 0;
      local_440.buf._M_elems[0] = '\0';
      pcVar5 = QTest::benchmarkMetricUnit((pQVar11->measurement).metric);
      dVar1 = (pQVar11->measurement).value;
      iVar10 = 0;
      if ((0.0 < dVar1) && (1.0 <= dVar1)) {
        iVar10 = 0;
        dVar14 = 1.0;
        do {
          dVar14 = dVar14 * 10.0;
          iVar10 = iVar10 + 1;
        } while (1.0 <= dVar1 / dVar14);
      }
      QTest::formatResult<double>(&local_458,dVar1 / (double)pQVar11->iterations,iVar10);
      pcVar7 = local_458.d.ptr;
      if (local_458.d.ptr == (char *)0x0) {
        pcVar7 = (char *)&QByteArray::_empty;
      }
      pcVar12 = "";
      if (pQVar11->setByMacro != false) {
        pcVar12 = " per iteration";
      }
      iVar3 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,"     %s %s%s",pcVar7,
                       pcVar5,pcVar12);
      local_440.used = local_440.used + (long)iVar3;
      piVar2 = (int *)CONCAT62(local_458.d.d._2_6_,CONCAT11(local_458.d.d._1_1_,local_458.d.d._0_1_)
                              );
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     CONCAT62(local_458.d.d._2_6_,CONCAT11(local_458.d.d._1_1_,local_458.d.d._0_1_))
                     ,1,0x10);
        }
      }
      switch((pQVar11->measurement).metric) {
      case BitsPerSecond:
        value = (pQVar11->measurement).value;
        pcVar5 = "bit/s";
        goto LAB_00120d16;
      case BytesPerSecond:
        dVar1 = (pQVar11->measurement).value;
        local_458.d.d._1_1_ = 0;
        dVar14 = 1.0;
        puVar6 = &(anonymous_namespace)::multiplePrefixes;
        if (1000.0 < dVar1) {
          lVar8 = 1;
          puVar6 = &(anonymous_namespace)::multiplePrefixes;
          do {
            puVar6 = puVar6 + 1;
            lVar9 = lVar8 * 0xfa000;
            lVar8 = lVar8 << 10;
          } while ((double)lVar9 < dVar1);
          dVar14 = (double)lVar8;
        }
        local_458.d.d._0_1_ = *puVar6;
        iVar3 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,", %.3g %s%s",
                         dVar1 / dVar14,&local_458,"B/s");
LAB_00120ee1:
        local_440.used = local_440.used + (long)iVar3;
        break;
      case CPUCycles:
      case RefCPUCycles:
        if ((local_470 != 0.0) || (NAN(local_470))) {
          value = (pQVar11->measurement).value / local_470;
          pcVar5 = "Hz";
          goto LAB_00120d16;
        }
        break;
      case Instructions:
        lVar8 = (results->d).size;
        if (lVar8 != 0) {
          pQVar4 = (results->d).ptr;
          lVar9 = 0;
          do {
            if (*(int *)((long)&(pQVar4->measurement).metric + lVar9) == 10) {
              iVar3 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,
                               ", %.3f instr/cycle",
                               (pQVar11->measurement).value /
                               *(double *)((long)&(pQVar4->measurement).value + lVar9));
              goto LAB_00120ee1;
            }
            lVar9 = lVar9 + 0x50;
          } while (lVar8 * 0x50 != lVar9);
        }
      case InstructionReads:
      case Events:
      case BytesAllocated:
      case CPUMigrations:
      case BusCycles:
      case StalledCycles:
      case BranchInstructions:
      case BranchMisses:
      case CacheReferences:
      case CacheReads:
      case CacheWrites:
      case CachePrefetches:
      case CacheMisses:
      case CacheReadMisses:
      case CacheWriteMisses:
      case CachePrefetchMisses:
      case ContextSwitches:
      case PageFaults:
      case MinorPageFaults:
      case MajorPageFaults:
      case AlignmentFaults:
      case EmulationFaults:
        if ((local_470 != 0.0) || (NAN(local_470))) {
          value = (pQVar11->measurement).value / local_470;
          pcVar5 = "/sec";
LAB_00120d16:
          anon_unknown.dwarf_a2a51::FixedBufString<1022>::appendScaled<1000>
                    (&local_440,value,pcVar5);
        }
      }
      QTest::formatResult<double>(&local_458,(pQVar11->measurement).value,iVar10);
      pcVar5 = local_458.d.ptr;
      if (local_458.d.ptr == (char *)0x0) {
        pcVar5 = (char *)&QByteArray::_empty;
      }
      iVar10 = snprintf(msg->_M_elems + local_440.used,0x3ff - local_440.used,
                        " (total: %s, iterations: %d)\n",pcVar5,(ulong)(uint)pQVar11->iterations);
      local_440.used = local_440.used + (long)iVar10;
      piVar2 = (int *)CONCAT62(local_458.d.d._2_6_,CONCAT11(local_458.d.d._1_1_,local_458.d.d._0_1_)
                              );
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     CONCAT62(local_458.d.d._2_6_,CONCAT11(local_458.d.d._1_1_,local_458.d.d._0_1_))
                     ,1,0x10);
        }
      }
      QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,msg->_M_elems);
      pQVar11 = pQVar11 + 1;
    } while (pQVar11 != pQVar13);
  }
LAB_00120eed:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTestLogger::printBenchmarkResults(const QList<QBenchmarkResult> &results)
{
    using namespace std::chrono;
    FixedBufString<1022> buf;
    auto findResultFor = [&results](QTest::QBenchmarkMetric metric) -> std::optional<qreal> {
        for (const QBenchmarkResult &result : results) {
            if (result.measurement.metric == metric)
                return result.measurement.value;
        }
        return std::nullopt;
    };

    // we need the execution time quite often, so find it first
    qreal executionTime = 0;
    if (auto ns = findResultFor(QTest::WalltimeNanoseconds))
        executionTime = *ns / (1000 * 1000 * 1000);
    else if (auto ms = findResultFor(QTest::WalltimeMilliseconds))
        executionTime = *ms / 1000;

    for (const QBenchmarkResult &result : results) {
        buf.clear();

        const char * unitText = QTest::benchmarkMetricUnit(result.measurement.metric);
        int significantDigits = QTest::countSignificantDigits(result.measurement.value);
        qreal valuePerIteration = qreal(result.measurement.value) / qreal(result.iterations);
        buf.appendf("     %s %s%s", QTest::formatResult(valuePerIteration, significantDigits).constData(),
                    unitText, result.setByMacro ? " per iteration" : "");

        switch (result.measurement.metric) {
        case QTest::BitsPerSecond:
            // for bits/s, we'll use powers of 10 (1 Mbit/s = 1000 kbit/s = 1000000 bit/s)
            buf.appendScaled<1000>(result.measurement.value, "bit/s");
            break;
        case QTest::BytesPerSecond:
            // for B/s, we'll use powers of 2 (1 MB/s = 1024 kB/s = 1048576 B/s)
            buf.appendScaled<1024>(result.measurement.value, "B/s");
            break;

        case QTest::CPUCycles:
        case QTest::RefCPUCycles:
            if (!qIsNull(executionTime))
                buf.appendScaled(result.measurement.value / executionTime, "Hz");
            break;

        case QTest::Instructions:
            if (auto cycles = findResultFor(QTest::CPUCycles)) {
                buf.appendf(", %.3f instr/cycle", result.measurement.value / *cycles);
                break;
            }
            Q_FALLTHROUGH();

        case QTest::InstructionReads:
        case QTest::Events:
        case QTest::BytesAllocated:
        case QTest::CPUMigrations:
        case QTest::BusCycles:
        case QTest::StalledCycles:
        case QTest::BranchInstructions:
        case QTest::BranchMisses:
        case QTest::CacheReferences:
        case QTest::CacheReads:
        case QTest::CacheWrites:
        case QTest::CachePrefetches:
        case QTest::CacheMisses:
        case QTest::CacheReadMisses:
        case QTest::CacheWriteMisses:
        case QTest::CachePrefetchMisses:
        case QTest::ContextSwitches:
        case QTest::PageFaults:
        case QTest::MinorPageFaults:
        case QTest::MajorPageFaults:
        case QTest::AlignmentFaults:
        case QTest::EmulationFaults:
            if (!qIsNull(executionTime))
                buf.appendScaled(result.measurement.value / executionTime, "/sec");
            break;

        case QTest::FramesPerSecond:
        case QTest::CPUTicks:
        case QTest::WalltimeMilliseconds:
        case QTest::WalltimeNanoseconds:
            break;  // no additional information
        }

        Q_ASSERT(result.iterations > 0);
        buf.appendf(" (total: %s, iterations: %d)\n",
                    QTest::formatResult(result.measurement.value, significantDigits).constData(),
                    result.iterations);

        outputMessage(buf);
    }
}